

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O2

int __thiscall
cubeb_mixer::mix(cubeb_mixer *this,size_t frames,void *input_buffer,size_t input_buffer_size,
                void *output_buffer,size_t output_buffer_size)

{
  uint8_t (*pauVar1) [33];
  float fVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  cubeb_sample_format cVar6;
  uint uVar7;
  size_t sVar8;
  short *psVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  float *pfVar13;
  uint32_t i;
  void *pvVar14;
  uint32_t uVar15;
  uint uVar16;
  float *pfVar17;
  int iVar18;
  undefined2 *puVar19;
  uint8_t *puVar20;
  ulong uVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  anon_class_1_0_00000001 f;
  uint32_t local_60;
  anon_class_1_0_00000001 f_1;
  undefined2 *local_40;
  
  iVar18 = 0;
  if ((frames != 0) && ((this->_context)._out_ch_count != 0)) {
    uVar7 = (this->_context)._in_ch_count;
    sVar8 = cubeb_sample_size((this->_context)._format);
    uVar10 = sVar8 * uVar7 * frames;
    iVar18 = -1;
    if (uVar10 < input_buffer_size || uVar10 - input_buffer_size == 0) {
      uVar24 = (ulong)(this->_context)._in_ch_count;
      uVar7 = (this->_context)._out_ch_count;
      uVar11 = (ulong)uVar7;
      if (uVar10 * uVar11 <= output_buffer_size * uVar24) {
        cVar6 = (this->_context)._format;
        if ((this->_context)._valid == false) {
          if (cVar6 == CUBEB_SAMPLE_FLOAT32LE) {
            copy_and_trunc<float>(this,frames,(float *)input_buffer,(float *)output_buffer);
          }
          else {
            copy_and_trunc<short>(this,frames,(short *)input_buffer,(short *)output_buffer);
          }
        }
        else {
          local_60 = (uint32_t)frames;
          if (cVar6 == CUBEB_SAMPLE_S16LE) {
            uVar10 = frames & 0xffffffff;
            if ((this->_context)._clipping == true) {
              puVar20 = (this->_context)._matrix_ch[0] + 1;
              for (uVar24 = 0; uVar15 = (uint32_t)uVar11, uVar24 < uVar11; uVar24 = uVar24 + 1) {
                psVar9 = (short *)((long)output_buffer + uVar24 * 2);
                pauVar1 = (this->_context)._matrix_ch + uVar24;
                uVar3 = (this->_context)._matrix_ch[uVar24][0];
                if (uVar3 == '\x02') {
                  sum2<short,int,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_1_&>
                            (psVar9,uVar15,(short *)((long)input_buffer + (ulong)(*pauVar1)[1] * 2),
                             (short *)((long)input_buffer + (ulong)(*pauVar1)[2] * 2),
                             (this->_context)._in_ch_count,
                             (this->_context)._matrix32[uVar24][(*pauVar1)[1]],
                             (this->_context)._matrix32[uVar24][(*pauVar1)[2]],&f,local_60);
                }
                else if (uVar3 == '\x01') {
                  copy<short,int,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_1_&>
                            (psVar9,uVar15,(short *)((long)input_buffer + (ulong)(*pauVar1)[1] * 2),
                             (this->_context)._in_ch_count,
                             (this->_context)._matrix32[uVar24][(*pauVar1)[1]],&f,local_60);
                }
                else if (uVar3 == '\0') {
                  uVar7 = 0;
                  uVar11 = uVar10;
                  while (bVar25 = uVar11 != 0, uVar11 = uVar11 - 1, bVar25) {
                    psVar9[uVar7] = 0;
                    uVar7 = uVar7 + uVar15;
                  }
                }
                else {
                  for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
                    iVar18 = 0;
                    for (uVar21 = 0; (*pauVar1)[0] != uVar21; uVar21 = uVar21 + 1) {
                      iVar18 = iVar18 + (int)*(short *)((long)input_buffer +
                                                       (ulong)puVar20[uVar21] * 2 +
                                                       (ulong)((this->_context)._in_ch_count *
                                                              (int)uVar11) * 2) *
                                        (this->_context)._matrix32[uVar24][puVar20[uVar21]];
                    }
                    iVar12 = iVar18 + 0x4000 >> 0xf;
                    iVar18 = (iVar18 < -0x4000) + 0x7fff;
                    if ((short)iVar12 == iVar12) {
                      iVar18 = iVar12;
                    }
                    psVar9[uVar15 * (int)uVar11] = (short)iVar18;
                  }
                }
                uVar11 = (ulong)(this->_context)._out_ch_count;
                puVar20 = puVar20 + 0x21;
              }
            }
            else {
              puVar20 = (this->_context)._matrix_ch[0] + 1;
              local_40 = (undefined2 *)output_buffer;
              for (uVar24 = 0; uVar15 = (uint32_t)uVar11, uVar24 < uVar11; uVar24 = uVar24 + 1) {
                psVar9 = (short *)((long)output_buffer + uVar24 * 2);
                pauVar1 = (this->_context)._matrix_ch + uVar24;
                uVar3 = (this->_context)._matrix_ch[uVar24][0];
                if (uVar3 == '\x02') {
                  sum2<short,int,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_2_&>
                            (psVar9,uVar15,(short *)((long)input_buffer + (ulong)(*pauVar1)[1] * 2),
                             (short *)((long)input_buffer + (ulong)(*pauVar1)[2] * 2),
                             (this->_context)._in_ch_count,
                             (this->_context)._matrix32[uVar24][(*pauVar1)[1]],
                             (this->_context)._matrix32[uVar24][(*pauVar1)[2]],&f_1,local_60);
                  uVar11 = (ulong)(this->_context)._out_ch_count;
                }
                else if (uVar3 == '\x01') {
                  psVar9 = (short *)((long)input_buffer + (ulong)(*pauVar1)[1] * 2);
                  uVar7 = (this->_context)._in_ch_count;
                  iVar18 = (this->_context)._matrix32[uVar24][(*pauVar1)[1]];
                  sVar8 = frames;
                  puVar19 = local_40;
                  while (iVar12 = (int)sVar8, sVar8 = (size_t)(iVar12 - 1), iVar12 != 0) {
                    *puVar19 = (short)(*psVar9 * iVar18 + 0x4000U >> 0xf);
                    psVar9 = psVar9 + uVar7;
                    puVar19 = puVar19 + uVar11;
                  }
                }
                else if (uVar3 == '\0') {
                  uVar23 = 0;
                  uVar21 = uVar10;
                  while (bVar25 = uVar21 != 0, uVar21 = uVar21 - 1, bVar25) {
                    psVar9[uVar23] = 0;
                    uVar23 = (ulong)((int)uVar23 + uVar15);
                  }
                }
                else {
                  for (uVar21 = 0; uVar21 != uVar10; uVar21 = uVar21 + 1) {
                    iVar18 = 0;
                    for (uVar23 = 0; (*pauVar1)[0] != uVar23; uVar23 = uVar23 + 1) {
                      iVar18 = iVar18 + (int)*(short *)((long)input_buffer +
                                                       (ulong)puVar20[uVar23] * 2 +
                                                       (ulong)((this->_context)._in_ch_count *
                                                              (int)uVar21) * 2) *
                                        (this->_context)._matrix32[uVar24][puVar20[uVar23]];
                    }
                    psVar9[uVar15 * (int)uVar21] = (short)(iVar18 + 0x4000U >> 0xf);
                  }
                }
                local_40 = local_40 + 1;
                puVar20 = puVar20 + 0x21;
              }
            }
          }
          else {
            if (cVar6 != CUBEB_SAMPLE_FLOAT32LE) {
              return -1;
            }
            puVar20 = (this->_context)._matrix_ch[0] + 1;
            pfVar13 = (float *)output_buffer;
            for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
              pauVar1 = (this->_context)._matrix_ch + uVar10;
              uVar3 = (this->_context)._matrix_ch[uVar10][0];
              if (uVar3 == '\x02') {
                bVar4 = (*pauVar1)[1];
                bVar5 = (*pauVar1)[2];
                fVar26 = (this->_context)._matrix_flt[uVar10][bVar4];
                fVar2 = (this->_context)._matrix_flt[uVar10][bVar5];
                pvVar14 = input_buffer;
                sVar8 = frames;
                pfVar22 = pfVar13;
                while (iVar18 = (int)sVar8, sVar8 = (size_t)(iVar18 - 1), iVar18 != 0) {
                  *pfVar22 = *(float *)((long)pvVar14 + (ulong)bVar4 * 4) * fVar26 +
                             *(float *)((long)pvVar14 + (ulong)bVar5 * 4) * fVar2;
                  pvVar14 = (void *)((long)pvVar14 + uVar24 * 4);
                  pfVar22 = pfVar22 + uVar11;
                }
              }
              else if (uVar3 == '\x01') {
                pfVar17 = (float *)((long)input_buffer + (ulong)(*pauVar1)[1] * 4);
                fVar26 = (this->_context)._matrix_flt[uVar10][(*pauVar1)[1]];
                sVar8 = frames;
                pfVar22 = pfVar13;
                while (iVar18 = (int)sVar8, sVar8 = (size_t)(iVar18 - 1), iVar18 != 0) {
                  *pfVar22 = *pfVar17 * fVar26;
                  pfVar17 = pfVar17 + uVar24;
                  pfVar22 = pfVar22 + uVar11;
                }
              }
              else if (uVar3 == '\0') {
                uVar16 = 0;
                uVar21 = frames & 0xffffffff;
                while (bVar25 = uVar21 != 0, uVar21 = uVar21 - 1, bVar25) {
                  *(undefined4 *)((long)output_buffer + (ulong)uVar16 * 4 + uVar10 * 4) = 0;
                  uVar16 = uVar16 + uVar7;
                }
              }
              else {
                for (uVar21 = 0; uVar21 != (frames & 0xffffffff); uVar21 = uVar21 + 1) {
                  fVar26 = 0.0;
                  for (uVar23 = 0; (*pauVar1)[0] != uVar23; uVar23 = uVar23 + 1) {
                    fVar26 = fVar26 + *(float *)((long)input_buffer +
                                                (ulong)puVar20[uVar23] * 4 +
                                                (ulong)((this->_context)._in_ch_count * (int)uVar21)
                                                * 4) *
                                      (this->_context)._matrix_flt[uVar10][puVar20[uVar23]];
                  }
                  *(float *)((long)output_buffer + (ulong)(uVar7 * (int)uVar21) * 4 + uVar10 * 4) =
                       fVar26;
                }
              }
              pfVar13 = pfVar13 + 1;
              puVar20 = puVar20 + 0x21;
            }
          }
        }
        iVar18 = 0;
      }
    }
  }
  return iVar18;
}

Assistant:

int mix(size_t frames,
          const void * input_buffer,
          size_t input_buffer_size,
          void * output_buffer,
          size_t output_buffer_size) const
  {
    if (frames <= 0 || _context._out_ch_count == 0) {
      return 0;
    }

    // Check if output buffer is of sufficient size.
    size_t size_read_needed =
      frames * _context._in_ch_count * cubeb_sample_size(_context._format);
    if (input_buffer_size < size_read_needed) {
      // We don't have enough data to read!
      return -1;
    }
    if (output_buffer_size * _context._in_ch_count <
        size_read_needed * _context._out_ch_count) {
      return -1;
    }

    if (!valid()) {
      // The channel layouts were invalid or unsupported, instead we will simply
      // either drop the extra channels, or fill with silence the missing ones
      if (_context._format == CUBEB_SAMPLE_FLOAT32NE) {
        copy_and_trunc(frames,
                       static_cast<const float*>(input_buffer),
                       static_cast<float*>(output_buffer));
      } else {
        assert(_context._format == CUBEB_SAMPLE_S16NE);
        copy_and_trunc(frames,
                       static_cast<const int16_t*>(input_buffer),
                       reinterpret_cast<int16_t*>(output_buffer));
      }
      return 0;
    }

    switch (_context._format)
    {
      case CUBEB_SAMPLE_FLOAT32NE: {
        auto f = [](float x) { return x; };
        return rematrix(&_context,
                        static_cast<float*>(output_buffer),
                        static_cast<const float*>(input_buffer),
                        _context._matrix_flt,
                        f,
                        frames);
      }
      case CUBEB_SAMPLE_S16NE:
        if (_context._clipping) {
          auto f = [](int x) {
            int y = (x + 16384) >> 15;
            // clip the signed integer value into the -32768,32767 range.
            if ((y + 0x8000U) & ~0xFFFF) {
              return (y >> 31) ^ 0x7FFF;
            }
            return y;
          };
          return rematrix(&_context,
                          static_cast<int16_t*>(output_buffer),
                          static_cast<const int16_t*>(input_buffer),
                          _context._matrix32,
                          f,
                          frames);
        } else {
          auto f = [](int x) { return (x + 16384) >> 15; };
          return rematrix(&_context,
                          static_cast<int16_t*>(output_buffer),
                          static_cast<const int16_t*>(input_buffer),
                          _context._matrix32,
                          f,
                          frames);
        }
        break;
      default:
        assert(false);
        break;
    }

    return -1;
  }